

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum.cpp
# Opt level: O3

int __thiscall Timidity::Renderer::load_missing_instruments(Renderer *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  
  iVar2 = 0;
  lVar3 = 0x7f;
  do {
    if ((&tonebank)[lVar3] != 0) {
      iVar1 = fill_bank(this,0,(int)lVar3);
      iVar2 = iVar2 + iVar1;
    }
    if ((&drumset)[lVar3] != 0) {
      iVar1 = fill_bank(this,1,(int)lVar3);
      iVar2 = iVar2 + iVar1;
    }
    bVar4 = lVar3 != 0;
    lVar3 = lVar3 + -1;
  } while (bVar4);
  return iVar2;
}

Assistant:

int Renderer::load_missing_instruments()
{
	int i = MAXBANK, errors = 0;
	while (i--)
	{
		if (tonebank[i] != NULL)
			errors += fill_bank(this, 0,i);
		if (drumset[i] != NULL)
			errors += fill_bank(this, 1,i);
	}
	return errors;
}